

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_interface.cpp
# Opt level: O0

int isotree_predict_distance
              (void *isotree_model,uint8_t output_triangular,uint8_t as_kernel,uint8_t standardize,
              uint8_t assume_full_distr,double *output_dist,size_t nrows,double *numeric_data,
              int *categ_data,double *csc_values,int *csc_indices,int *csc_indptr)

{
  ostream *poVar1;
  long in_RDI;
  long in_R9;
  exception *e;
  IsolationForest *model;
  bool in_stack_000000d4;
  bool in_stack_000000d5;
  bool in_stack_000000d6;
  bool in_stack_000000d7;
  undefined4 in_stack_000000d8;
  bool in_stack_000000dc;
  bool in_stack_000000dd;
  bool in_stack_000000de;
  bool in_stack_000000df;
  int *in_stack_000000e0;
  int *in_stack_000000e8;
  double *in_stack_000000f0;
  IsolationForest *in_stack_000000f8;
  IsolationForest *in_stack_00000100;
  double *in_stack_00000130;
  double *in_stack_00000150;
  int local_1c;
  
  if (in_RDI == 0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "Passed NULL \'isotree_model\' to \'isotree_predict_distance\'.");
    std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
    local_1c = 1;
  }
  else if (in_R9 == 0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "Passed NULL \'output_dist\' to \'isotree_predict_distance\'.");
    std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
    local_1c = 1;
  }
  else {
    if (e == (exception *)0x0) {
      isotree::IsolationForest::predict_distance
                (in_stack_000000f8,in_stack_000000f0,in_stack_000000e8,(size_t)in_stack_000000e0,
                 in_stack_000000df,in_stack_000000de,in_stack_000000dd,in_stack_000000dc,
                 in_stack_00000130);
    }
    else {
      isotree::IsolationForest::predict_distance
                (in_stack_00000100,(double *)in_stack_000000f8,(int *)in_stack_000000f0,
                 in_stack_000000e8,in_stack_000000e0,
                 CONCAT17(in_stack_000000df,
                          CONCAT16(in_stack_000000de,
                                   CONCAT15(in_stack_000000dd,
                                            CONCAT14(in_stack_000000dc,in_stack_000000d8)))),
                 in_stack_000000d7,in_stack_000000d6,in_stack_000000d5,in_stack_000000d4,
                 in_stack_00000150);
    }
    local_1c = 0;
  }
  return local_1c;
}

Assistant:

ISOTREE_EXPORTED
int isotree_predict_distance
(
    void *isotree_model,
    uint8_t output_triangular,
    uint8_t as_kernel,
    uint8_t standardize,
    uint8_t assume_full_distr,
    double *output_dist,
    size_t nrows,
    double *numeric_data,
    int *categ_data,
    double *csc_values,
    int *csc_indices,
    int *csc_indptr
)
{
    if (!isotree_model) {
        cerr << "Passed NULL 'isotree_model' to 'isotree_predict_distance'." << std::endl;
        return IsoTreeError;
    }
    if (!output_dist) {
        cerr << "Passed NULL 'output_dist' to 'isotree_predict_distance'." << std::endl;
        return IsoTreeError;
    }
    IsolationForest *model = (IsolationForest*)isotree_model;

    try
    {
        if (!csc_indptr) {
            model->predict_distance(numeric_data, categ_data,
                                    nrows, as_kernel,
                                    (bool) assume_full_distr, (bool) standardize,
                                    (bool) output_triangular,
                                    output_dist);
        }

        else {
            model->predict_distance(csc_values, csc_indices, csc_indptr, categ_data,
                                    nrows, as_kernel, (bool) assume_full_distr, (bool) standardize,
                                    (bool) output_triangular,
                                    output_dist);
        }

        return IsoTreeSuccess;
    }

    catch (std::exception &e)
    {
        cerr << e.what();
        cerr.flush();
    }

    return IsoTreeError;
}